

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

void __thiscall Table::Table(Table *this,Table *other)

{
  Table *other_local;
  Table *this_local;
  
  this->_vptr_Table = (_func_int **)&PTR__Table_00120860;
  this->capacity = other->capacity;
  this->open = (bool)(other->open & 1);
  std::vector<Customer_*,_std::allocator<Customer_*>_>::vector
            (&this->customersList,&other->customersList);
  std::vector<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>::vector
            (&this->orderList,&other->orderList);
  return;
}

Assistant:

Table::Table(Table &&other) : capacity(other.capacity), open(other.open), customersList(std::move(other.customersList)), orderList(std::move(other.orderList))
{
}